

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

bool cmLocalGeneratorCheckObjectName(string *objName,size_type dir_len,size_type max_total_len)

{
  ulong uVar1;
  size_type max_obj_len;
  size_type max_total_len_local;
  size_type dir_len_local;
  string *objName_local;
  
  if (dir_len < max_total_len) {
    uVar1 = std::__cxx11::string::size();
    if (max_total_len - dir_len < uVar1) {
      objName_local._7_1_ = cmLocalGeneratorShortenObjectName(objName,max_total_len - dir_len);
    }
    else {
      objName_local._7_1_ = true;
    }
  }
  else {
    objName_local._7_1_ = false;
  }
  return objName_local._7_1_;
}

Assistant:

static
bool cmLocalGeneratorCheckObjectName(std::string& objName,
                                     std::string::size_type dir_len,
                                     std::string::size_type max_total_len)
{
  // Enforce the maximum file name length if possible.
  std::string::size_type max_obj_len = max_total_len;
  if(dir_len < max_total_len)
    {
    max_obj_len = max_total_len - dir_len;
    if(objName.size() > max_obj_len)
      {
      // The current object file name is too long.  Try to shorten it.
      return cmLocalGeneratorShortenObjectName(objName, max_obj_len);
      }
    else
      {
      // The object file name is short enough.
      return true;
      }
    }
  else
    {
    // The build directory in which the object will be stored is
    // already too deep.
    return false;
    }
}